

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  SRes SVar6;
  ulong uVar7;
  Byte *pBVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  UInt32 dictSize;
  uint uVar12;
  
  SVar6 = 4;
  if (4 < propsSize) {
    uVar2 = *(uint *)(props + 1);
    uVar12 = 0x1000;
    if (0x1000 < uVar2) {
      uVar12 = uVar2;
    }
    bVar1 = *props;
    if (bVar1 < 0xe1) {
      uVar5 = bVar1 / 9;
      cVar4 = (char)uVar5;
      bVar10 = bVar1 + cVar4 * -9;
      bVar3 = cVar4 + (char)(uVar5 * 0x34 >> 8) * -5;
      SVar6 = LzmaDec_AllocateProbs2(p,(CLzmaProps *)(ulong)bVar10,(ISzAlloc *)(ulong)bVar3);
      if (SVar6 == 0) {
        uVar9 = 0xfff;
        if (0x3fffff < uVar2) {
          uVar9 = 0xfffff;
        }
        uVar11 = 0x3fffff;
        if (uVar2 < 0x40000000) {
          uVar11 = uVar9;
        }
        uVar7 = (ulong)uVar12;
        uVar9 = ~uVar11 & uVar11 + uVar7;
        if (uVar9 <= uVar7) {
          uVar9 = uVar7;
        }
        if ((p->dic == (Byte *)0x0) || (uVar9 != p->dicBufSize)) {
          (*alloc->Free)(alloc,p->dic);
          p->dic = (Byte *)0x0;
          pBVar8 = (Byte *)(*alloc->Alloc)(alloc,uVar9);
          p->dic = pBVar8;
          if (pBVar8 == (Byte *)0x0) {
            (*alloc->Free)(alloc,p->probs);
            p->probs = (UInt16 *)0x0;
            return 2;
          }
        }
        cVar4 = (char)((uint)bVar1 * 0x6d >> 8);
        p->dicBufSize = uVar9;
        (p->prop).lc = (uint)bVar10;
        (p->prop).lp = (uint)bVar3;
        (p->prop).pb = (uint)((byte)(((byte)(bVar1 - cVar4) >> 1) + cVar4) >> 5);
        (p->prop).dicSize = uVar12;
        SVar6 = 0;
      }
    }
  }
  return SVar6;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));

  {
    UInt32 dictSize = propNew.dicSize;
    SizeT mask = ((UInt32)1 << 12) - 1;
         if (dictSize >= ((UInt32)1 << 30)) mask = ((UInt32)1 << 22) - 1;
    else if (dictSize >= ((UInt32)1 << 22)) mask = ((UInt32)1 << 20) - 1;;
    dicBufSize = ((SizeT)dictSize + mask) & ~mask;
    if (dicBufSize < dictSize)
      dicBufSize = dictSize;
  }

  if (!p->dic || dicBufSize != p->dicBufSize)
  {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte *)alloc->Alloc(alloc, dicBufSize);
    if (!p->dic)
    {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}